

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_mesh_completeness.cc
# Opt level: O0

vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
* lf::mesh::test_utils::isWatertightMesh
            (vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
             *__return_storage_ptr__,Mesh *mesh,bool vertices_only)

{
  double dVar1;
  RealScalar RVar2;
  source_loc loc;
  format_string_t<unsigned_int_&,_const_lf::base::RefEl_&,_unsigned_int> fmt;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  size_type sVar7;
  undefined4 extraout_var;
  reference ppEVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Scalar *pSVar9;
  undefined4 extraout_var_02;
  reference ppEVar10;
  undefined4 extraout_var_03;
  __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this;
  element_type *this_00;
  uint local_1bc;
  char *local_1b8;
  size_t local_1b0;
  source_loc local_1a8;
  uint local_18c;
  ConstColXpr local_188;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_150;
  Matrix<double,__1,__1,_0,__1,__1> local_108;
  Matrix<double,__1,__1,_0,__1,__1> local_f0;
  undefined1 local_d8 [8];
  VectorXd node_coords;
  undefined1 auStack_c0 [4];
  sub_idx_t j;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> sub_ents;
  double approx_area;
  MatrixXd vertex_coords;
  MatrixXd *ref_el_corners;
  Entity *pEStack_70;
  RefEl e_refel;
  Entity *e;
  iterator __end3;
  iterator __begin3;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3;
  uint local_38;
  dim_t codim_pt;
  int co_dim;
  Matrix<double,_0,_1,_0,_0,_1> local_22;
  undefined1 local_21;
  uint local_20;
  Matrix<double,_0,_1,_0,_0,_1> pt_ref_coord;
  dim_t dim_mesh;
  bool vertices_only_local;
  Mesh *mesh_local;
  vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
  *ret_vals;
  
  local_20 = (**mesh->_vptr_Mesh)();
  local_21 = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
  ::vector(__return_storage_ptr__);
  Eigen::Matrix<double,_0,_1,_0,_0,_1>::Matrix(&local_22);
  for (local_38 = local_20; 0 < (int)local_38; local_38 = local_38 - 1) {
    uVar5 = local_20 - local_38;
    iVar6 = (*mesh->_vptr_Mesh[2])(mesh,(ulong)local_38);
    __begin3._M_current = (Entity **)CONCAT44(extraout_var,iVar6);
    __end3 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
    e = (Entity *)
        std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                  ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
    while (bVar4 = __gnu_cxx::
                   operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                             (&__end3,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                       *)&e), ((bVar4 ^ 0xffU) & 1) != 0) {
      ppEVar8 = __gnu_cxx::
                __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                ::operator*(&__end3);
      pEStack_70 = *ppEVar8;
      iVar6 = (*pEStack_70->_vptr_Entity[4])();
      ref_el_corners._7_1_ = (undefined1)iVar6;
      vertex_coords.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols = (Index)lf::base::RefEl::NodeCoords((RefEl *)((long)&ref_el_corners + 7));
      iVar6 = (*pEStack_70->_vptr_Entity[3])();
      (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x18))
                (&approx_area,(long *)CONCAT44(extraout_var_00,iVar6),
                 vertex_coords.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_cols);
      iVar6 = (*pEStack_70->_vptr_Entity[3])();
      (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar6) + 0x30))
                (&sub_ents._M_extent,(long *)CONCAT44(extraout_var_01,iVar6),
                 vertex_coords.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_cols);
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &sub_ents._M_extent,0);
      dVar1 = *pSVar9;
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)&sub_ents._M_extent);
      iVar6 = (*pEStack_70->_vptr_Entity[1])(pEStack_70,(ulong)uVar5);
      _auStack_c0 = (pointer)CONCAT44(extraout_var_02,iVar6);
      for (node_coords.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows._4_4_ = 0;
          uVar3 = node_coords.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows._4_4_,
          sVar7 = lf::base::RefEl::NumNodes((RefEl *)((long)&ref_el_corners + 7)), uVar3 < sVar7;
          node_coords.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows._4_4_ = node_coords.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows._4_4_ + 1) {
        ppEVar10 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                             ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                              auStack_c0,
                              (ulong)node_coords.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_rows._4_4_);
        iVar6 = (*(*ppEVar10)->_vptr_Entity[3])();
        Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,0,1,0,0,1>>
                  ((Matrix<double,_1,_1,0,_1,_1> *)&local_108,
                   (EigenBase<Eigen::Matrix<double,_0,_1,_0,_0,_1>_> *)&local_22);
        (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar6) + 0x18))
                  (&local_f0,(long *)CONCAT44(extraout_var_03,iVar6),&local_108);
        Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((Matrix<double,_1,1,0,_1,1> *)local_d8,&local_f0);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_f0);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_108);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                  (&local_188,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&approx_area,
                   (ulong)node_coords.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                          .m_storage.m_rows._4_4_);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>>::
        operator-(&local_150,
                  (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>> *)
                  &local_188,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_d8);
        RVar2 = Eigen::
                MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)&local_150);
        if (dVar1 * 1e-08 < RVar2) {
          local_18c = (*mesh->_vptr_Mesh[5])(mesh,pEStack_70);
          std::
          vector<std::pair<lf::base::RefEl,unsigned_int>,std::allocator<std::pair<lf::base::RefEl,unsigned_int>>>
          ::emplace_back<lf::base::RefEl_const&,unsigned_int>
                    ((vector<std::pair<lf::base::RefEl,unsigned_int>,std::allocator<std::pair<lf::base::RefEl,unsigned_int>>>
                      *)__return_storage_ptr__,(RefEl *)((long)&ref_el_corners + 7),&local_18c);
          this = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 WatertightLogger();
          this_00 = std::
                    __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->(this);
          spdlog::source_loc::source_loc
                    (&local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/test_utils/check_mesh_completeness.cc"
                     ,0x75,"isWatertightMesh");
          local_1b8 = "Node {} of {} ({}): position mismatch";
          local_1b0 = 0x25;
          local_1bc = (*mesh->_vptr_Mesh[5])(mesh,pEStack_70);
          fmt.str_.size_ = local_1b0;
          fmt.str_.data_ = local_1b8;
          loc.line = local_1a8.line;
          loc._12_4_ = local_1a8._12_4_;
          loc.filename = local_1a8.filename;
          loc.funcname = local_1a8.funcname;
          spdlog::logger::log<unsigned_int&,lf::base::RefEl_const&,unsigned_int>
                    (this_00,loc,trace,fmt,
                     (uint *)((long)&node_coords.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_rows + 4),(RefEl *)((long)&ref_el_corners + 7),
                     &local_1bc);
        }
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_d8)
        ;
      }
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)&approx_area);
      __gnu_cxx::
      __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
      ::operator++(&__end3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<lf::base::RefEl, base::glb_idx_t>> isWatertightMesh(
    const Mesh& mesh, bool vertices_only) {
  base::dim_t dim_mesh = mesh.DimMesh();
  std::vector<std::pair<lf::base::RefEl, base::glb_idx_t>> ret_vals{};

  // "Reference coordinates" for a point: dummy argument
  Eigen::Matrix<double, 0, 1> pt_ref_coord;

  // Loop over cells and edges
  for (int co_dim = dim_mesh; co_dim > 0; co_dim--) {
    base::dim_t codim_pt = dim_mesh - co_dim;  // co-dim of vertices
    // Loop over entities of the specified co-dimension
    for (const Entity* e : mesh.Entities(co_dim)) {
      const lf::base::RefEl e_refel = e->RefEl();
      const Eigen::MatrixXd& ref_el_corners(e_refel.NodeCoords());
      const Eigen::MatrixXd vertex_coords(
          e->Geometry()->Global(ref_el_corners));
      const double approx_area =
          (e->Geometry()->IntegrationElement(ref_el_corners))[0];
      // Visit all nodes
      auto sub_ents = e->SubEntities(codim_pt);
      for (base::sub_idx_t j = 0; j < e_refel.NumNodes(); ++j) {
        const Eigen::VectorXd node_coords(
            sub_ents[j]->Geometry()->Global(pt_ref_coord));
        // Check agreement of coordinates up to roundoff
        if ((vertex_coords.col(j) - node_coords).squaredNorm() >
            1.0E-8 * approx_area) {
          ret_vals.emplace_back(e_refel, mesh.Index(*e));

          SPDLOG_LOGGER_TRACE(WatertightLogger(),
                              "Node {} of {} ({}): position mismatch", j,
                              e_refel, mesh.Index(*e));

        }  // end geometry test
      }  // end loop over nodes
    }  // end loop over entities
  }  // end loop over co-dimensions
  if (!vertices_only) {
    // Check whether geometry of edges and cells match
    // ASSERT_MSG(false,
    //	    "Geometric compatibility test for edges and cells not yet
    // implemented");
  }

  return ret_vals;
}